

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3pBufferDataUploadTests.cpp
# Opt level: O0

int __thiscall
deqp::gles3::Performance::anon_unknown_1::
BasicUploadCase<deqp::gles3::Performance::(anonymous_namespace)::SingleOperationDuration>::init
          (BasicUploadCase<deqp::gles3::Performance::(anonymous_namespace)::SingleOperationDuration>
           *this,EVP_PKEY_CTX *ctx)

{
  int iVar1;
  deUint32 err;
  int extraout_EAX;
  RenderContext *pRVar2;
  undefined4 extraout_var;
  TestLog *pTVar3;
  MessageBuilder *pMVar4;
  BasicUploadCase<deqp::gles3::Performance::(anonymous_namespace)::SingleOperationDuration>
  *extraout_RAX;
  int numBytes;
  int numBytes_00;
  MessageBuilder local_c70;
  MessageBuilder local_af0;
  MessageBuilder local_970;
  MessageBuilder local_7f0;
  MessageBuilder local_670;
  MessageBuilder local_4f0;
  MessageBuilder local_370;
  string local_1f0;
  string local_1d0;
  MessageBuilder local_1a0;
  value_type_conflict5 local_19;
  long local_18;
  Functions *gl;
  BasicUploadCase<deqp::gles3::Performance::(anonymous_namespace)::SingleOperationDuration>
  *this_local;
  
  gl = (Functions *)this;
  pRVar2 = gles3::Context::getRenderContext
                     ((this->
                      super_BasicBufferCase<deqp::gles3::Performance::(anonymous_namespace)::SingleOperationDuration>
                      ).super_TestCase.m_context);
  iVar1 = (*pRVar2->_vptr_RenderContext[3])();
  local_18 = CONCAT44(extraout_var,iVar1);
  BasicBufferCase<deqp::gles3::Performance::(anonymous_namespace)::SingleOperationDuration>::init
            (&this->
              super_BasicBufferCase<deqp::gles3::Performance::(anonymous_namespace)::SingleOperationDuration>
             ,ctx);
  local_19 = '\0';
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
            (&this->m_zeroData,
             (long)(this->
                   super_BasicBufferCase<deqp::gles3::Performance::(anonymous_namespace)::SingleOperationDuration>
                   ).m_bufferSizeMax,&local_19);
  (**(code **)(local_18 + 0x6c8))(1,&this->m_dummyBufferID);
  err = (**(code **)(local_18 + 0x800))();
  glu::checkError(err,"Gen buf",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles3/performance/es3pBufferDataUploadTests.cpp"
                  ,0x8e5);
  pTVar3 = tcu::TestContext::getLog
                     ((this->
                      super_BasicBufferCase<deqp::gles3::Performance::(anonymous_namespace)::SingleOperationDuration>
                      ).super_TestCase.super_TestCase.super_TestNode.m_testCtx);
  tcu::TestLog::operator<<(&local_1a0,pTVar3,(BeginMessageToken *)&tcu::TestLog::Message);
  pMVar4 = tcu::MessageBuilder::operator<<(&local_1a0,(char (*) [26])"Testing performance with ");
  pMVar4 = tcu::MessageBuilder::operator<<
                     (pMVar4,&(this->
                              super_BasicBufferCase<deqp::gles3::Performance::(anonymous_namespace)::SingleOperationDuration>
                              ).m_numSamples);
  pMVar4 = tcu::MessageBuilder::operator<<
                     (pMVar4,(char (*) [130])
                             " test samples. Sample order is randomized. All samples at even positions (first = 0) are tested before samples at odd positions.\n"
                     );
  pMVar4 = tcu::MessageBuilder::operator<<(pMVar4,(char (*) [28])"Buffer sizes are in range [");
  Performance::(anonymous_namespace)::getHumanReadableByteSize_abi_cxx11_
            (&local_1d0,
             (_anonymous_namespace_ *)
             (ulong)(uint)(this->
                          super_BasicBufferCase<deqp::gles3::Performance::(anonymous_namespace)::SingleOperationDuration>
                          ).m_bufferSizeMin,numBytes);
  pMVar4 = tcu::MessageBuilder::operator<<(pMVar4,&local_1d0);
  pMVar4 = tcu::MessageBuilder::operator<<(pMVar4,(char (*) [3])0x2a3caab);
  Performance::(anonymous_namespace)::getHumanReadableByteSize_abi_cxx11_
            (&local_1f0,
             (_anonymous_namespace_ *)
             (ulong)(uint)(this->
                          super_BasicBufferCase<deqp::gles3::Performance::(anonymous_namespace)::SingleOperationDuration>
                          ).m_bufferSizeMax,numBytes_00);
  pMVar4 = tcu::MessageBuilder::operator<<(pMVar4,&local_1f0);
  pMVar4 = tcu::MessageBuilder::operator<<(pMVar4,(char (*) [3])0x2aea36f);
  tcu::MessageBuilder::operator<<(pMVar4,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::string::~string((string *)&local_1f0);
  std::__cxx11::string::~string((string *)&local_1d0);
  tcu::MessageBuilder::~MessageBuilder(&local_1a0);
  if ((this->m_logBufferInfo & 1U) != 0) {
    switch(this->m_caseType) {
    case CASE_NO_BUFFERS:
      break;
    case CASE_NEW_BUFFER:
      pTVar3 = tcu::TestContext::getLog
                         ((this->
                          super_BasicBufferCase<deqp::gles3::Performance::(anonymous_namespace)::SingleOperationDuration>
                          ).super_TestCase.super_TestCase.super_TestNode.m_testCtx);
      tcu::TestLog::operator<<(&local_370,pTVar3,(BeginMessageToken *)&tcu::TestLog::Message);
      pMVar4 = tcu::MessageBuilder::operator<<
                         (&local_370,
                          (char (*) [78])
                          "Target buffer is generated but not specified (i.e glBufferData() not called)."
                         );
      tcu::MessageBuilder::operator<<(pMVar4,(EndMessageToken *)&tcu::TestLog::EndMessage);
      tcu::MessageBuilder::~MessageBuilder(&local_370);
      break;
    case CASE_UNSPECIFIED_BUFFER:
      pTVar3 = tcu::TestContext::getLog
                         ((this->
                          super_BasicBufferCase<deqp::gles3::Performance::(anonymous_namespace)::SingleOperationDuration>
                          ).super_TestCase.super_TestCase.super_TestNode.m_testCtx);
      tcu::TestLog::operator<<(&local_4f0,pTVar3,(BeginMessageToken *)&tcu::TestLog::Message);
      pMVar4 = tcu::MessageBuilder::operator<<
                         (&local_4f0,
                          (char (*) [52])"Target buffer is allocated with glBufferData(NULL).");
      tcu::MessageBuilder::operator<<(pMVar4,(EndMessageToken *)&tcu::TestLog::EndMessage);
      tcu::MessageBuilder::~MessageBuilder(&local_4f0);
      break;
    case CASE_SPECIFIED_BUFFER:
      pTVar3 = tcu::TestContext::getLog
                         ((this->
                          super_BasicBufferCase<deqp::gles3::Performance::(anonymous_namespace)::SingleOperationDuration>
                          ).super_TestCase.super_TestCase.super_TestNode.m_testCtx);
      tcu::TestLog::operator<<(&local_670,pTVar3,(BeginMessageToken *)&tcu::TestLog::Message);
      pMVar4 = tcu::MessageBuilder::operator<<
                         (&local_670,
                          (char (*) [76])
                          "Target buffer contents are specified prior testing with glBufferData(data)."
                         );
      tcu::MessageBuilder::operator<<(pMVar4,(EndMessageToken *)&tcu::TestLog::EndMessage);
      tcu::MessageBuilder::~MessageBuilder(&local_670);
      break;
    case CASE_USED_BUFFER:
      pTVar3 = tcu::TestContext::getLog
                         ((this->
                          super_BasicBufferCase<deqp::gles3::Performance::(anonymous_namespace)::SingleOperationDuration>
                          ).super_TestCase.super_TestCase.super_TestNode.m_testCtx);
      tcu::TestLog::operator<<(&local_7f0,pTVar3,(BeginMessageToken *)&tcu::TestLog::Message);
      pMVar4 = tcu::MessageBuilder::operator<<
                         (&local_7f0,
                          (char (*) [55])"Target buffer has been used in drawing before testing.");
      tcu::MessageBuilder::operator<<(pMVar4,(EndMessageToken *)&tcu::TestLog::EndMessage);
      tcu::MessageBuilder::~MessageBuilder(&local_7f0);
      break;
    case CASE_USED_LARGER_BUFFER:
      pTVar3 = tcu::TestContext::getLog
                         ((this->
                          super_BasicBufferCase<deqp::gles3::Performance::(anonymous_namespace)::SingleOperationDuration>
                          ).super_TestCase.super_TestCase.super_TestNode.m_testCtx);
      tcu::TestLog::operator<<(&local_970,pTVar3,(BeginMessageToken *)&tcu::TestLog::Message);
      pMVar4 = tcu::MessageBuilder::operator<<
                         (&local_970,
                          (char (*) [69])
                          "Target buffer is larger and has been used in drawing before testing.");
      tcu::MessageBuilder::operator<<(pMVar4,(EndMessageToken *)&tcu::TestLog::EndMessage);
      tcu::MessageBuilder::~MessageBuilder(&local_970);
    }
  }
  if (this->m_resultType == RESULT_MEDIAN_TRANSFER_RATE) {
    pTVar3 = tcu::TestContext::getLog
                       ((this->
                        super_BasicBufferCase<deqp::gles3::Performance::(anonymous_namespace)::SingleOperationDuration>
                        ).super_TestCase.super_TestCase.super_TestNode.m_testCtx);
    tcu::TestLog::operator<<(&local_af0,pTVar3,(BeginMessageToken *)&tcu::TestLog::Message);
    pMVar4 = tcu::MessageBuilder::operator<<
                       (&local_af0,
                        (char (*) [61])
                        "Test result is the median transfer rate of the test samples.");
    tcu::MessageBuilder::operator<<(pMVar4,(EndMessageToken *)&tcu::TestLog::EndMessage);
    tcu::MessageBuilder::~MessageBuilder(&local_af0);
    iVar1 = extraout_EAX;
  }
  else {
    if (this->m_resultType == RESULT_ASYMPTOTIC_TRANSFER_RATE) {
      pTVar3 = tcu::TestContext::getLog
                         ((this->
                          super_BasicBufferCase<deqp::gles3::Performance::(anonymous_namespace)::SingleOperationDuration>
                          ).super_TestCase.super_TestCase.super_TestNode.m_testCtx);
      tcu::TestLog::operator<<(&local_c70,pTVar3,(BeginMessageToken *)&tcu::TestLog::Message);
      pMVar4 = tcu::MessageBuilder::operator<<
                         (&local_c70,
                          (char (*) [84])
                          "Test result is the asymptotic transfer rate as the buffer size approaches infinity."
                         );
      tcu::MessageBuilder::operator<<(pMVar4,(EndMessageToken *)&tcu::TestLog::EndMessage);
      tcu::MessageBuilder::~MessageBuilder(&local_c70);
      this = extraout_RAX;
    }
    iVar1 = (int)this;
  }
  return iVar1;
}

Assistant:

void BasicUploadCase<SampleType>::init (void)
{
	const glw::Functions& gl = m_context.getRenderContext().getFunctions();

	BasicBufferCase<SampleType>::init();

	// zero buffer as upload source
	m_zeroData.resize(m_bufferSizeMax, 0x00);

	// dummy buffer

	gl.genBuffers(1, &m_dummyBufferID);
	GLU_EXPECT_NO_ERROR(gl.getError(), "Gen buf");

	// log basic info

	m_testCtx.getLog()
		<< tcu::TestLog::Message
		<< "Testing performance with " << m_numSamples << " test samples. Sample order is randomized. All samples at even positions (first = 0) are tested before samples at odd positions.\n"
		<< "Buffer sizes are in range [" << getHumanReadableByteSize(m_bufferSizeMin) << ", " << getHumanReadableByteSize(m_bufferSizeMax) << "]."
		<< tcu::TestLog::EndMessage;

	if (m_logBufferInfo)
	{
		switch (m_caseType)
		{
			case CASE_NO_BUFFERS:
				break;

			case CASE_NEW_BUFFER:
				m_testCtx.getLog() << tcu::TestLog::Message << "Target buffer is generated but not specified (i.e glBufferData() not called)." << tcu::TestLog::EndMessage;
				break;

			case CASE_UNSPECIFIED_BUFFER:
				m_testCtx.getLog() << tcu::TestLog::Message << "Target buffer is allocated with glBufferData(NULL)." << tcu::TestLog::EndMessage;
				break;

			case CASE_SPECIFIED_BUFFER:
				m_testCtx.getLog() << tcu::TestLog::Message << "Target buffer contents are specified prior testing with glBufferData(data)." << tcu::TestLog::EndMessage;
				break;

			case CASE_USED_BUFFER:
				m_testCtx.getLog() << tcu::TestLog::Message << "Target buffer has been used in drawing before testing." << tcu::TestLog::EndMessage;
				break;

			case CASE_USED_LARGER_BUFFER:
				m_testCtx.getLog() << tcu::TestLog::Message << "Target buffer is larger and has been used in drawing before testing." << tcu::TestLog::EndMessage;
				break;

			default:
				DE_ASSERT(false);
				break;
		}
	}

	if (m_resultType == RESULT_MEDIAN_TRANSFER_RATE)
		m_testCtx.getLog() << tcu::TestLog::Message << "Test result is the median transfer rate of the test samples." << tcu::TestLog::EndMessage;
	else if (m_resultType == RESULT_ASYMPTOTIC_TRANSFER_RATE)
		m_testCtx.getLog() << tcu::TestLog::Message << "Test result is the asymptotic transfer rate as the buffer size approaches infinity." << tcu::TestLog::EndMessage;
	else
		DE_ASSERT(false);
}